

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O3

bool __thiscall
vkt::shaderexecutor::anon_unknown_0::FloatBitsToUintIntCaseInstance::compare
          (FloatBitsToUintIntCaseInstance *this,void **inputs,void **outputs)

{
  pointer pSVar1;
  uint uVar2;
  uint uVar3;
  ostream *poVar4;
  ostringstream *this_00;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  bool bVar9;
  Hex<8UL> local_38;
  
  pSVar1 = (this->super_CommonFunctionTestInstance).m_spec.inputs.
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar5 = *(uint *)((long)&(pSVar1->varType).m_data + 4);
  uVar3 = glu::getDataTypeScalarSize((pSVar1->varType).m_data.basic.type);
  bVar9 = true;
  if (0 < (int)uVar3) {
    uVar7 = **inputs;
    uVar6 = **outputs - uVar7;
    uVar2 = -uVar6;
    if (0 < (int)uVar6) {
      uVar2 = uVar6;
    }
    uVar5 = ~(-1 << (0x17 - (&DAT_00b2c45c)[(ulong)uVar5 * 4] & 0x1f));
    uVar8 = 0;
    bVar9 = false;
    if ((int)uVar2 <= (int)uVar5) {
      uVar8 = 0;
      do {
        if ((ulong)uVar3 - 1 == uVar8) {
          return true;
        }
        uVar7 = *(uint *)((long)*inputs + (uVar8 + 1) * 4);
        uVar6 = *(int *)((long)*outputs + (uVar8 + 1) * 4) - uVar7;
        uVar2 = -uVar6;
        if (0 < (int)uVar6) {
          uVar2 = uVar6;
        }
        uVar8 = uVar8 + 1;
      } while ((int)uVar2 <= (int)uVar5);
      bVar9 = uVar3 <= uVar8;
    }
    this_00 = &(this->super_CommonFunctionTestInstance).m_failMsg;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Expected [",10);
    poVar4 = (ostream *)std::ostream::operator<<(this_00,(int)uVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] = ",4);
    local_38.value = (deUint64)uVar7;
    poVar4 = tcu::Format::Hex<8UL>::toStream(&local_38,poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," with threshold ",0x10);
    local_38.value = (deUint64)uVar5;
    poVar4 = tcu::Format::Hex<8UL>::toStream(&local_38,poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,", got diff ",0xb);
    local_38.value = (ulong)uVar2;
    tcu::Format::Hex<8UL>::toStream(&local_38,poVar4);
  }
  return bVar9;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		const int				mantissaBits	= getMinMantissaBits(precision);
		const int				maxUlpDiff		= getMaxUlpDiffFromBits(mantissaBits);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const float		in0			= ((const float*)inputs[0])[compNdx];
			const deUint32	out0		= ((const deUint32*)outputs[0])[compNdx];
			const deUint32	refOut0		= tcu::Float32(in0).bits();
			const int		ulpDiff		= de::abs((int)out0 - (int)refOut0);

			if (ulpDiff > maxUlpDiff)
			{
				m_failMsg << "Expected [" << compNdx << "] = " << tcu::toHex(refOut0) << " with threshold "
							<< tcu::toHex(maxUlpDiff) << ", got diff " << tcu::toHex(ulpDiff);
				return false;
			}
		}

		return true;
	}